

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall
QFutureInterfaceBase::setProgressValueAndText
          (QFutureInterfaceBase *this,int progressValue,QString *progressText)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  void *__s;
  ProgressData *pPVar4;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  bool useProgressRange;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffff38;
  QFutureCallOutEvent *in_stack_ffffffffffffff40;
  QString *in_stack_ffffffffffffff48;
  QFutureCallOutEvent *callOutEvent;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  bVar2 = QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
          ::operator!((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                       *)(*(long *)(in_RDI + 8) + 200));
  if (bVar2) {
    __s = operator_new(0x20);
    memset(__s,0,0x20);
    QFutureInterfaceBasePrivate::ProgressData::ProgressData((ProgressData *)0x6decee);
    QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
    ::reset((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
             *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
            (ProgressData *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  pPVar4 = QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
           ::operator->((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                         *)(*(long *)(in_RDI + 8) + 200));
  bVar2 = true;
  if (pPVar4->maximum == 0) {
    pPVar4 = QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
             ::operator->((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                           *)(*(long *)(in_RDI + 8) + 200));
    bVar2 = pPVar4->minimum != 0;
  }
  if ((((!bVar2) ||
       ((pPVar4 = QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                  ::operator->((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                                *)(*(long *)(in_RDI + 8) + 200)), pPVar4->minimum <= in_ESI &&
        (in_stack_ffffffffffffff5c = in_ESI,
        pPVar4 = QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                 ::operator->((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                               *)(*(long *)(in_RDI + 8) + 200)),
        in_stack_ffffffffffffff5c <= pPVar4->maximum)))) &&
      (*(int *)(*(long *)(in_RDI + 8) + 0xc4) < in_ESI)) &&
     ((uVar3 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x6dedff),
      (uVar3 & 0xc) == 0 &&
      (bVar2 = QFutureInterfaceBasePrivate::internal_updateProgress
                         ((QFutureInterfaceBasePrivate *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          in_stack_ffffffffffffff54,in_stack_ffffffffffffff48), bVar2)))) {
    callOutEvent = *(QFutureCallOutEvent **)(in_RDI + 8);
    uVar5 = *(undefined4 *)&callOutEvent[3].field_0x1c;
    QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
    ::operator->((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                  *)&callOutEvent[3].text);
    QFutureCallOutEvent::QFutureCallOutEvent
              ((QFutureCallOutEvent *)CONCAT44(uVar5,in_stack_ffffffffffffff50),
               (CallOutType)((ulong)callOutEvent >> 0x20),(int)callOutEvent,
               (QString *)in_stack_ffffffffffffff40);
    QFutureInterfaceBasePrivate::sendCallOut
              ((QFutureInterfaceBasePrivate *)CONCAT44(uVar5,in_stack_ffffffffffffff50),callOutEvent
              );
    QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_ffffffffffffff40);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff40);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::setProgressValueAndText(int progressValue,
                                                   const QString &progressText)
{
    QMutexLocker locker(&d->m_mutex);
    if (!d->m_progress)
        d->m_progress.reset(new QFutureInterfaceBasePrivate::ProgressData());

    const bool useProgressRange = (d->m_progress->maximum != 0) || (d->m_progress->minimum != 0);
    if (useProgressRange
        && ((progressValue < d->m_progress->minimum) || (progressValue > d->m_progress->maximum))) {
        return;
    }

    if (d->m_progressValue >= progressValue)
        return;

    if (d->state.loadRelaxed() & (Canceled|Finished))
        return;

    if (d->internal_updateProgress(progressValue, progressText)) {
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Progress,
                                           d->m_progressValue,
                                           d->m_progress->text));
    }
}